

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O1

numeric_type __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::eval
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<double,_std::allocator<double>_> *v)

{
  rt_expression_interface<double> *prVar1;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar2;
  numeric_type extraout_XMM0_Qa;
  
  prVar1 = (this->expr_)._M_ptr;
  poVar2 = (this->op_)._M_ptr;
  (*prVar1->_vptr_rt_expression_interface[5])(prVar1);
  (*poVar2->_vptr_op_interface[4])(poVar2);
  return extraout_XMM0_Qa;
}

Assistant:

InterfaceType * simplify() const
      {
        if (expr_->is_constant())
        {
          if (op_->can_simplify())
            return new rt_constant<numeric_type, InterfaceType>( op_->apply(expr_->unwrap()) );
          else
            return new rt_unary_expr(new rt_constant<numeric_type, InterfaceType>(expr_->unwrap()),
                                     op_->clone());
        }

        //TODO: Unwrap op_id()

        return new rt_unary_expr(expr_->simplify(), op_->clone());
      }